

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactorUtils.cpp
# Opt level: O2

void __thiscall HFactor::reportAsm(HFactor *this)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  long lVar5;
  HighsInt k;
  long lVar6;
  long lVar7;
  ulong uVar8;
  
  for (lVar5 = 1; lVar5 <= this->num_row; lVar5 = lVar5 + 1) {
    uVar2 = (this->col_link_first).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar5];
    if (-1 < (int)uVar2) {
      for (; uVar2 != 0xffffffff;
          uVar2 = (this->col_link_next).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[(int)uVar2]) {
        dVar1 = (this->mc_min_pivot).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[(int)uVar2];
        uVar3 = (this->mc_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[(int)uVar2];
        lVar6 = (long)(int)uVar3;
        uVar8 = (this->mc_count_a).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[(int)uVar2] + lVar6;
        printf("Col %4d: count = %2d; min_pivot = %10.4g; [%4d, %4d)\n",(ulong)uVar2,lVar5,
               (ulong)uVar3,uVar8 & 0xffffffff);
        for (; lVar6 < (long)uVar8; lVar6 = lVar6 + 1) {
          lVar7 = (long)(this->mc_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar6];
          uVar3 = (this->mr_count).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar7];
          pcVar4 = "";
          if (dVar1 <= ABS((this->mc_value).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start[lVar6])) {
            pcVar4 = "OK";
          }
          printf("   Row %4d; Count = %2d; Merit = %11.4g; Value = %11.4g: %s\n",
                 (double)(int)(uVar3 - 1) * (double)((int)lVar5 + -1),lVar7,(ulong)uVar3,pcVar4);
        }
      }
    }
  }
  return;
}

Assistant:

void HFactor::reportAsm() {
  for (HighsInt count = 1; count <= num_row; count++) {
    if (col_link_first[count] < 0) continue;
    for (HighsInt j = col_link_first[count]; j != -1; j = col_link_next[j]) {
      double min_pivot = mc_min_pivot[j];
      HighsInt start = mc_start[j];
      HighsInt end = start + mc_count_a[j];
      printf("Col %4d: count = %2d; min_pivot = %10.4g; [%4d, %4d)\n", (int)j,
             (int)count, min_pivot, (int)start, (int)end);
      for (HighsInt k = start; k < end; k++) {
        HighsInt i = mc_index[k];
        double value = mc_value[k];
        //	if (abs_value < 1e-8) continue;
        HighsInt row_count = mr_count[i];
        double merit_local = 1.0 * (count - 1) * (row_count - 1);
        printf("   Row %4d; Count = %2d; Merit = %11.4g; Value = %11.4g: %s\n",
               (int)i, (int)row_count, merit_local, value,
               std::abs(value) >= min_pivot ? "OK" : "");
      }
    }
  }
}